

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_queue.hpp
# Opt level: O1

void __thiscall
boost::asio::detail::op_queue<boost::asio::detail::reactor_op>::~op_queue
          (op_queue<boost::asio::detail::reactor_op> *this)

{
  long *plVar1;
  long lVar2;
  code *pcVar3;
  reactor_op *tmp;
  undefined4 local_30 [2];
  error_category *local_28;
  
  do {
    plVar1 = *(long **)this;
    if (plVar1 == (long *)0x0) {
      return;
    }
    lVar2 = *plVar1;
    *(long *)this = lVar2;
    if (lVar2 == 0) {
      *(undefined8 *)(this + 8) = 0;
    }
    *plVar1 = 0;
    pcVar3 = (code *)plVar1[1];
    local_30[0] = 0;
    local_28 = system::system_category();
    (*pcVar3)(0,plVar1,local_30,0);
  } while (plVar1 != (long *)0x0);
  return;
}

Assistant:

~op_queue()
  {
    while (Operation* op = front_)
    {
      pop();
      op_queue_access::destroy(op);
    }
  }